

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdaptorTest.cpp
# Opt level: O2

void __thiscall AdaptorTest_QueueTest_Test::TestBody(AdaptorTest_QueueTest_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  char *in_R9;
  AssertHelper local_110;
  int local_104;
  AssertionResult gtest_ar_;
  AssertHelper local_f0;
  AssertionResult gtest_ar;
  queue<int,_Deque<int,_std::allocator<int>_>_> q;
  
  std::queue<int,Deque<int,std::allocator<int>>>::queue<Deque<int,std::allocator<int>>,void>
            ((queue<int,Deque<int,std::allocator<int>>> *)&q.c);
  for (gtest_ar._0_4_ = 0; (int)gtest_ar._0_4_ < 100; gtest_ar._0_4_ = gtest_ar._0_4_ + 1) {
    Deque<int,_std::allocator<int>_>::push_back(&q.c,(value_type *)&gtest_ar);
  }
  this_00 = &gtest_ar.message_;
  local_104 = 0;
  do {
    if (99 < local_104) {
LAB_0013415f:
      Deque<int,_std::allocator<int>_>::~Deque(&q.c);
      return;
    }
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = q.c.current_.size_ != 0;
    if (q.c.current_.size_ == 0) {
      testing::Message::Message((Message *)&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"q.empty()","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/AdaptorTest.cpp"
                 ,0x1e,(char *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_));
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_110);
      this_00 = &gtest_ar_.message_;
LAB_0013415a:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(this_00);
      goto LAB_0013415f;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"q.front()","i",(*q.c.current_.begin_)->begin,&local_104);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/AdaptorTest.cpp"
                 ,0x1f,message);
      testing::internal::AssertHelper::operator=(&local_110,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
      goto LAB_0013415a;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(this_00);
    Deque<int,_std::allocator<int>_>::pop_front(&q.c);
    local_104 = local_104 + 1;
  } while( true );
}

Assistant:

TEST(AdaptorTest, QueueTest) {
    std::queue<int, Deque<int>> q;
    for (int i = 0; i < 100; ++i) {
        q.push(i);
    }

    for (int i = 0; i < 100; ++i) {
        ASSERT_FALSE(q.empty());
        ASSERT_EQ(q.front(), i);
        q.pop();
    }
}